

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O3

void m68k_op_andi_8_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint addr_in;
  
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar1 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  my_fc_handler(m68ki_cpu.s_flag | 2);
  uVar3 = m68ki_cpu.pc & m68ki_cpu.address_mask;
  m68ki_cpu.pc = m68ki_cpu.pc + 2;
  my_fc_handler(m68ki_cpu.s_flag | 2);
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(uVar3);
  }
  uVar2 = m68k_read_memory_16(uVar3 & m68ki_cpu.address_mask);
  addr_in = (uint)(short)uVar2;
  my_fc_handler(m68ki_address_space | m68ki_cpu.s_flag);
  uVar3 = addr_in;
  if (m68ki_cpu.pmmu_enabled != 0) {
    uVar3 = pmmu_translate_addr(addr_in);
  }
  uVar2 = m68k_read_memory_8(uVar3 & m68ki_cpu.address_mask);
  uVar2 = uVar1 & 0xff & uVar2;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.n_flag = uVar2;
  m68ki_cpu.not_z_flag = uVar2;
  my_fc_handler(m68ki_cpu.s_flag | 1);
  if (m68ki_cpu.pmmu_enabled != 0) {
    addr_in = pmmu_translate_addr(addr_in);
  }
  m68k_write_memory_8(addr_in & m68ki_cpu.address_mask,uVar2);
  return;
}

Assistant:

static void m68k_op_andi_8_aw(void)
{
	uint src = OPER_I_8();
	uint ea = EA_AW_8();
	uint res = src & m68ki_read_8(ea);

	FLAG_N = NFLAG_8(res);
	FLAG_Z = res;
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;

	m68ki_write_8(ea, res);
}